

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int png_image_begin_read_from_stdio(png_imagep image,FILE *file)

{
  int iVar1;
  char *error_message;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (file != (FILE *)0x0) {
      iVar1 = png_image_read_init(image);
      if (iVar1 == 0) {
        return 0;
      }
      image->opaque->png_ptr->io_ptr = file;
      iVar1 = png_safe_execute(image,png_image_read_header,image);
      return iVar1;
    }
    error_message = "png_image_begin_read_from_stdio: invalid argument";
  }
  else {
    error_message = "png_image_begin_read_from_stdio: incorrect PNG_IMAGE_VERSION";
  }
  iVar1 = png_image_error(image,error_message);
  return iVar1;
}

Assistant:

int PNGAPI
png_image_begin_read_from_stdio(png_imagep image, FILE* file)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file != NULL)
      {
         if (png_image_read_init(image) != 0)
         {
            /* This is slightly evil, but png_init_io doesn't do anything other
             * than this and we haven't changed the standard IO functions so
             * this saves a 'safe' function.
             */
            image->opaque->png_ptr->io_ptr = file;
            return png_safe_execute(image, png_image_read_header, image);
         }
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_stdio: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_stdio: incorrect PNG_IMAGE_VERSION");

   return 0;
}